

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O2

int TRUST_TOKEN_ISSUER_issue
              (TRUST_TOKEN_ISSUER *ctx,uint8_t **out,size_t *out_len,size_t *out_tokens_issued,
              uint8_t *request,size_t request_len,uint32_t public_metadata,uint8_t private_metadata,
              size_t max_issuance)

{
  int iVar1;
  int iVar2;
  trust_token_issuer_key_st *ptVar3;
  ulong uVar4;
  uint16_t num_requested;
  size_t *local_88;
  uint8_t **local_80;
  size_t *local_78;
  CBS in;
  CBB response;
  
  if (ctx->max_batchsize < max_issuance) {
    max_issuance = (ulong)ctx->max_batchsize;
  }
  local_88 = out_tokens_issued;
  local_80 = out;
  local_78 = out_len;
  ptVar3 = trust_token_issuer_get_key(ctx,public_metadata);
  if ((private_metadata < 2 && ptVar3 != (trust_token_issuer_key_st *)0x0) &&
     ((private_metadata == '\0' || (ctx->method->has_private_metadata != 0)))) {
    in.data = request;
    in.len = request_len;
    iVar1 = CBS_get_u16(&in,&num_requested);
    if (iVar1 != 0) {
      uVar4 = (ulong)num_requested;
      if (max_issuance < num_requested) {
        uVar4 = max_issuance;
      }
      iVar1 = 0;
      iVar2 = CBB_init(&response,0);
      if ((((iVar2 != 0) && (iVar2 = CBB_add_u16(&response,(uint16_t)uVar4), iVar2 != 0)) &&
          (iVar2 = CBB_add_u32(&response,public_metadata), iVar2 != 0)) &&
         (iVar2 = (*ctx->method->sign)
                            (&ptVar3->key,&response,&in,(size_t)num_requested,uVar4,private_metadata
                            ), iVar1 = 0, iVar2 != 0)) {
        if (in.len == 0) {
          iVar2 = CBB_finish(&response,local_80,local_78);
          if (iVar2 != 0) {
            *local_88 = uVar4;
            iVar1 = 1;
          }
        }
        else {
          ERR_put_error(0x20,0,0x69,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                        ,0x232);
          iVar1 = 0;
        }
      }
      CBB_cleanup(&response);
      return iVar1;
    }
    iVar1 = 0x69;
    iVar2 = 0x21c;
  }
  else {
    iVar1 = 0x6a;
    iVar2 = 0x214;
  }
  ERR_put_error(0x20,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,iVar2);
  return 0;
}

Assistant:

int TRUST_TOKEN_ISSUER_issue(const TRUST_TOKEN_ISSUER *ctx, uint8_t **out,
                             size_t *out_len, size_t *out_tokens_issued,
                             const uint8_t *request, size_t request_len,
                             uint32_t public_metadata, uint8_t private_metadata,
                             size_t max_issuance) {
  if (max_issuance > ctx->max_batchsize) {
    max_issuance = ctx->max_batchsize;
  }

  const struct trust_token_issuer_key_st *key =
      trust_token_issuer_get_key(ctx, public_metadata);
  if (key == NULL || private_metadata > 1 ||
      (!ctx->method->has_private_metadata && private_metadata != 0)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_METADATA);
    return 0;
  }

  CBS in;
  uint16_t num_requested;
  CBS_init(&in, request, request_len);
  if (!CBS_get_u16(&in, &num_requested)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  size_t num_to_issue = num_requested;
  if (num_to_issue > max_issuance) {
    num_to_issue = max_issuance;
  }

  int ret = 0;
  CBB response;
  if (!CBB_init(&response, 0) || !CBB_add_u16(&response, num_to_issue) ||
      !CBB_add_u32(&response, public_metadata)) {
    goto err;
  }

  if (!ctx->method->sign(&key->key, &response, &in, num_requested, num_to_issue,
                         private_metadata)) {
    goto err;
  }

  if (CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    goto err;
  }

  if (!CBB_finish(&response, out, out_len)) {
    goto err;
  }

  *out_tokens_issued = num_to_issue;
  ret = 1;

err:
  CBB_cleanup(&response);
  return ret;
}